

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O2

void __thiscall GraphTestNestedPhonyPrintsDone::Run(GraphTestNestedPhonyPrintsDone *this)

{
  Test *pTVar1;
  bool bVar2;
  Node *pNVar3;
  string err;
  Plan plan_;
  allocator<char> local_c9;
  string local_c8;
  string local_a8;
  Plan local_88;
  
  AssertParse(&(this->super_GraphTest).super_StateTestWithBuiltinRules.state_,
              "build n1: phony \nbuild n2: phony n1\n",(ManifestParserOptions)0x0);
  pTVar1 = g_current_test;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"n2",(allocator<char> *)&local_a8);
  pNVar3 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,(string *)&local_88)
  ;
  bVar2 = DependencyScan::RecomputeDirty(&(this->super_GraphTest).scan_,pNVar3,&local_c8);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
             ,0x13d,"scan_.RecomputeDirty(GetNode(\"n2\"), &err)");
  std::__cxx11::string::~string((string *)&local_88);
  pTVar1 = g_current_test;
  bVar2 = std::operator==("",&local_c8);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
                     ,0x13e,"\"\" == err");
  if (!bVar2) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    goto LAB_00150f8c;
  }
  Plan::Plan(&local_88,(Builder *)0x0);
  pTVar1 = g_current_test;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"n2",&local_c9);
  pNVar3 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_a8);
  bVar2 = Plan::AddTarget(&local_88,pNVar3,&local_c8);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
             ,0x141,"plan_.AddTarget(GetNode(\"n2\"), &err)");
  std::__cxx11::string::~string((string *)&local_a8);
  pTVar1 = g_current_test;
  bVar2 = std::operator==("",&local_c8);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
                     ,0x142,"\"\" == err");
  if (bVar2) {
    testing::Test::Check
              (g_current_test,local_88.command_edges_ == 0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
               ,0x144,"0 == plan_.command_edge_count()");
    bVar2 = testing::Test::Check
                      (g_current_test,local_88.command_edges_ < 1 || local_88.wanted_edges_ < 1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
                       ,0x145,"plan_.more_to_do()");
    if (!bVar2) goto LAB_00150f77;
  }
  else {
LAB_00150f77:
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  Plan::~Plan(&local_88);
LAB_00150f8c:
  std::__cxx11::string::~string((string *)&local_c8);
  return;
}

Assistant:

TEST_F(GraphTest, NestedPhonyPrintsDone) {
  AssertParse(&state_,
"build n1: phony \n"
"build n2: phony n1\n"
  );
  string err;
  EXPECT_TRUE(scan_.RecomputeDirty(GetNode("n2"), &err));
  ASSERT_EQ("", err);

  Plan plan_;
  EXPECT_TRUE(plan_.AddTarget(GetNode("n2"), &err));
  ASSERT_EQ("", err);

  EXPECT_EQ(0, plan_.command_edge_count());
  ASSERT_FALSE(plan_.more_to_do());
}